

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O2

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc:234:39)>_>
::Visit<>(VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_mock_code_generator_cc:234:39)>_>
          *this,Descriptor *descriptor)

{
  FeatureSet *pFVar1;
  bool bVar2;
  ConstType pTVar3;
  EnumDescriptor *this_00;
  OneofDescriptor *pOVar4;
  FieldDescriptor *pFVar5;
  Descriptor *this_01;
  ExtensionRange *pEVar6;
  int i;
  uint uVar7;
  int iVar8;
  EnumDescriptor *descriptor_00;
  FieldDescriptor *pFVar9;
  Descriptor *descriptor_01;
  LogMessage local_30;
  
  pFVar1 = *(FeatureSet **)(this + 0x38);
  bVar2 = FeatureSet::
          HasExtension<google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,(unsigned_char)11,false,google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>>
                    (pFVar1,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                             *)pb::test);
  if (bVar2) {
    pTVar3 = FeatureSet::
             GetExtension<google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false,_0>
                       (pFVar1,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                                *)pb::test);
    if ((undefined1  [76])((undefined1  [76])pTVar3->field_0 & (undefined1  [76])0x1) ==
        (undefined1  [76])0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_30,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                 ,0xee,"features.GetExtension(pb::test).has_file_feature()");
      absl::lts_20250127::log_internal::LogMessage::operator<<
                (&local_30,(char (*) [41])"Test features were not resolved properly");
    }
    else {
      pTVar3 = FeatureSet::
               GetExtension<google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false,_0>
                         (pFVar1,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                                  *)pb::test);
      if ((undefined1  [76])((undefined1  [76])pTVar3->field_0 & (undefined1  [76])0x800) ==
          (undefined1  [76])0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_30,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                   ,0xf0,"features.GetExtension(pb::test).has_source_feature()");
        absl::lts_20250127::log_internal::LogMessage::operator<<
                  (&local_30,(char (*) [41])"Test features were not resolved properly");
      }
      else {
        for (uVar7 = 0; (int)uVar7 < *(int *)(this + 0x8c); uVar7 = uVar7 + 1) {
          descriptor_00 = (EnumDescriptor *)(ulong)uVar7;
          this_00 = Descriptor::enum_type((Descriptor *)this,uVar7);
          Visit<>((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_mock_code_generator_cc:234:39)>_>
                   *)this_00,descriptor_00);
        }
        iVar8 = 0;
        while (iVar8 < *(int *)(this + 0x80)) {
          pOVar4 = Descriptor::oneof_decl((Descriptor *)this,iVar8);
          pFVar1 = pOVar4->merged_features_;
          bVar2 = FeatureSet::
                  HasExtension<google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,(unsigned_char)11,false,google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>>
                            (pFVar1,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                                     *)pb::test);
          if (!bVar2) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_30,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                       ,0xec,"features.HasExtension(pb::test)");
            absl::lts_20250127::log_internal::LogMessage::operator<<
                      (&local_30,(char (*) [41])"Test features were not resolved properly");
            goto LAB_00180d55;
          }
          pTVar3 = FeatureSet::
                   GetExtension<google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false,_0>
                             (pFVar1,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                                      *)pb::test);
          if ((undefined1  [76])((undefined1  [76])pTVar3->field_0 & (undefined1  [76])0x1) ==
              (undefined1  [76])0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_30,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                       ,0xee,"features.GetExtension(pb::test).has_file_feature()");
            absl::lts_20250127::log_internal::LogMessage::operator<<
                      (&local_30,(char (*) [41])"Test features were not resolved properly");
            goto LAB_00180d55;
          }
          pTVar3 = FeatureSet::
                   GetExtension<google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false,_0>
                             (pFVar1,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                                      *)pb::test);
          iVar8 = iVar8 + 1;
          if ((undefined1  [76])((undefined1  [76])pTVar3->field_0 & (undefined1  [76])0x800) ==
              (undefined1  [76])0x0) goto code_r0x00180ab8;
        }
        for (uVar7 = 0; (int)uVar7 < *(int *)(this + 8); uVar7 = uVar7 + 1) {
          pFVar9 = (FieldDescriptor *)(ulong)uVar7;
          pFVar5 = Descriptor::field((Descriptor *)this,uVar7);
          Visit<>((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_mock_code_generator_cc:234:39)>_>
                   *)pFVar5,pFVar9);
        }
        for (uVar7 = 0; (int)uVar7 < *(int *)(this + 0x88); uVar7 = uVar7 + 1) {
          descriptor_01 = (Descriptor *)(ulong)uVar7;
          this_01 = Descriptor::nested_type((Descriptor *)this,uVar7);
          Visit<>((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_mock_code_generator_cc:234:39)>_>
                   *)this_01,descriptor_01);
        }
        for (uVar7 = 0; (int)uVar7 < *(int *)(this + 0x94); uVar7 = uVar7 + 1) {
          pFVar9 = (FieldDescriptor *)(ulong)uVar7;
          pFVar5 = Descriptor::extension((Descriptor *)this,uVar7);
          Visit<>((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_mock_code_generator_cc:234:39)>_>
                   *)pFVar5,pFVar9);
        }
        iVar8 = 0;
        while( true ) {
          if (*(int *)(this + 0x90) <= iVar8) {
            return;
          }
          pEVar6 = Descriptor::extension_range((Descriptor *)this,iVar8);
          pFVar1 = pEVar6->merged_features_;
          bVar2 = FeatureSet::
                  HasExtension<google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,(unsigned_char)11,false,google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>>
                            (pFVar1,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                                     *)pb::test);
          if (!bVar2) break;
          pTVar3 = FeatureSet::
                   GetExtension<google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false,_0>
                             (pFVar1,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                                      *)pb::test);
          if ((undefined1  [76])((undefined1  [76])pTVar3->field_0 & (undefined1  [76])0x1) ==
              (undefined1  [76])0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_30,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                       ,0xee,"features.GetExtension(pb::test).has_file_feature()");
            absl::lts_20250127::log_internal::LogMessage::operator<<
                      (&local_30,(char (*) [41])"Test features were not resolved properly");
            goto LAB_00180d55;
          }
          pTVar3 = FeatureSet::
                   GetExtension<google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false,_0>
                             (pFVar1,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                                      *)pb::test);
          iVar8 = iVar8 + 1;
          if ((undefined1  [76])((undefined1  [76])pTVar3->field_0 & (undefined1  [76])0x800) ==
              (undefined1  [76])0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_30,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                       ,0xf0,"features.GetExtension(pb::test).has_source_feature()");
            absl::lts_20250127::log_internal::LogMessage::operator<<
                      (&local_30,(char (*) [41])"Test features were not resolved properly");
            goto LAB_00180d55;
          }
        }
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_30,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                   ,0xec,"features.HasExtension(pb::test)");
        absl::lts_20250127::log_internal::LogMessage::operator<<
                  (&local_30,(char (*) [41])"Test features were not resolved properly");
      }
    }
  }
  else {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
               ,0xec,"features.HasExtension(pb::test)");
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&local_30,(char (*) [41])"Test features were not resolved properly");
  }
LAB_00180d55:
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
code_r0x00180ab8:
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
             ,0xf0,"features.GetExtension(pb::test).has_source_feature()");
  absl::lts_20250127::log_internal::LogMessage::operator<<
            (&local_30,(char (*) [41])"Test features were not resolved properly");
  goto LAB_00180d55;
}

Assistant:

void Visit(const Descriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);

    for (int i = 0; i < descriptor.enum_type_count(); i++) {
      Visit(*descriptor.enum_type(i), enum_type(proto, i)...);
    }

    for (int i = 0; i < descriptor.oneof_decl_count(); i++) {
      Visit(*descriptor.oneof_decl(i), oneof_decl(proto, i)...);
    }

    for (int i = 0; i < descriptor.field_count(); i++) {
      Visit(*descriptor.field(i), field(proto, i)...);
    }

    for (int i = 0; i < descriptor.nested_type_count(); i++) {
      Visit(*descriptor.nested_type(i), nested_type(proto, i)...);
    }

    for (int i = 0; i < descriptor.extension_count(); i++) {
      Visit(*descriptor.extension(i), extension(proto, i)...);
    }

    for (int i = 0; i < descriptor.extension_range_count(); i++) {
      Visit(*descriptor.extension_range(i), extension_range(proto, i)...);
    }
  }